

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLNodeLinOp.cpp
# Opt level: O0

void __thiscall amrex::MLNodeLinOp::setOversetMask(MLNodeLinOp *this,int amrlev,iMultiFab *a_dmask)

{
  int iVar1;
  bool bVar2;
  FabArrayBase *fabarray_;
  long in_RDI;
  int i;
  int j;
  int k;
  Dim3 amrex_i_hi;
  Dim3 amrex_i_lo;
  Box *bx;
  Array4<int> *dmsk;
  Array4<const_int> *omsk;
  MFIter mfi;
  size_type in_stack_fffffffffffffd78;
  MFIter *in_stack_fffffffffffffd80;
  FabArray<amrex::IArrayBox> *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 in_stack_fffffffffffffdb4;
  int iVar3;
  int local_248;
  int local_244;
  MFIter *in_stack_fffffffffffffde0;
  undefined1 local_204 [36];
  undefined1 local_1e0 [136];
  MFIter *local_158;
  MFIter local_150;
  pointer local_c8;
  pointer local_a0;
  int local_8c;
  int local_88;
  int local_84;
  MFIter *local_80;
  int local_74;
  int local_70;
  int local_6c;
  unique_ptr<amrex::FabArray<amrex::IArrayBox>,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
  local_68;
  undefined4 local_5c;
  undefined1 *local_58;
  undefined4 local_4c;
  undefined1 *local_48;
  undefined4 local_3c;
  undefined1 *local_38;
  undefined4 local_2c;
  pointer local_28;
  undefined4 local_1c;
  pointer local_18;
  undefined4 local_c;
  pointer local_8;
  
  Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
  ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
  fabarray_ = (FabArrayBase *)
              std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator*
                        ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)
                         in_stack_fffffffffffffd80);
  TilingIfNotGPU();
  MFIter::MFIter((MFIter *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0),fabarray_,
                 SUB81((ulong)in_RDI >> 0x38,0));
  while (bVar2 = MFIter::isValid(&local_150), bVar2) {
    in_stack_fffffffffffffd80 = (MFIter *)(local_1e0 + 0x48);
    FabArray<amrex::IArrayBox>::const_array<amrex::IArrayBox,_0>
              (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    local_158 = in_stack_fffffffffffffd80;
    Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
    ::operator[]((Vector<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>,_std::allocator<amrex::Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>_>_>
                  *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>,_std::allocator<std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>_>_>
                  *)in_stack_fffffffffffffd80,in_stack_fffffffffffffd78);
    std::unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_>::operator->
              ((unique_ptr<amrex::iMultiFab,_std::default_delete<amrex::iMultiFab>_> *)0x1687209);
    in_stack_fffffffffffffd88 = (FabArray<amrex::IArrayBox> *)local_1e0;
    FabArray<amrex::IArrayBox>::array<amrex::IArrayBox,_0>
              (in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
    local_1e0._64_8_ = in_stack_fffffffffffffd88;
    MFIter::tilebox(in_stack_fffffffffffffde0);
    local_c = 0;
    local_1c = 1;
    in_stack_fffffffffffffde0 = (MFIter *)CONCAT44(local_204._4_4_,local_204._0_4_);
    local_2c = 2;
    local_38 = local_204 + 0xc;
    local_3c = 0;
    local_48 = local_204 + 0xc;
    local_4c = 1;
    local_58 = local_204 + 0xc;
    local_5c = 2;
    for (local_244 = local_204._8_4_; local_248 = local_204._4_4_,
        local_244 <= (int)local_204._20_4_; local_244 = local_244 + 1) {
      for (; iVar1 = local_204._0_4_, local_248 <= (int)local_204._16_4_; local_248 = local_248 + 1)
      {
        while (iVar3 = iVar1, iVar3 <= (int)local_204._12_4_) {
          local_80 = local_158;
          local_88 = local_248;
          local_8c = local_244;
          local_68._M_t.
          super___uniq_ptr_impl<amrex::FabArray<amrex::IArrayBox>,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_amrex::FabArray<amrex::IArrayBox>_*,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>_>
          .super__Head_base<0UL,_amrex::FabArray<amrex::IArrayBox>_*,_false>._M_head_impl =
               (__uniq_ptr_data<amrex::FabArray<amrex::IArrayBox>,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>,_true,_true>
                )(__uniq_ptr_data<amrex::FabArray<amrex::IArrayBox>,_std::default_delete<amrex::FabArray<amrex::IArrayBox>_>,_true,_true>
                  )local_1e0._64_8_;
          local_70 = local_248;
          local_74 = local_244;
          *(int *)(*(long *)local_1e0._64_8_ +
                  ((long)(iVar3 - *(int *)(local_1e0._64_8_ + 0x20)) +
                   (long)(local_248 - *(int *)(local_1e0._64_8_ + 0x24)) *
                   *(long *)&((BoxArray *)(local_1e0._64_8_ + 8))->m_bat +
                  (long)(local_244 - *(int *)(local_1e0._64_8_ + 0x28)) *
                  *(long *)(local_1e0._64_8_ + 0x10)) * 4) =
               1 - *(int *)((long)&((local_158->m_fa)._M_t.
                                    super___uniq_ptr_impl<amrex::FabArrayBase,_std::default_delete<amrex::FabArrayBase>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_amrex::FabArrayBase_*,_std::default_delete<amrex::FabArrayBase>_>
                                    .super__Head_base<0UL,_amrex::FabArrayBase_*,_false>.
                                   _M_head_impl)->_vptr_FabArrayBase +
                           ((long)(iVar3 - local_158->currentIndex) +
                            (long)(local_248 - local_158->beginIndex) * (long)local_158->fabArray +
                           (long)(local_244 - local_158->endIndex) *
                           *(long *)(local_158->tile_size).vect) * 4);
          local_84 = iVar3;
          local_6c = iVar3;
          iVar1 = iVar3 + 1;
        }
      }
    }
    local_204._28_8_ = (pointer)local_204;
    local_c8 = (pointer)local_204;
    local_a0 = (pointer)local_204;
    local_28 = (pointer)local_204;
    local_18 = (pointer)local_204;
    local_8 = (pointer)local_204;
    MFIter::operator++(&local_150);
  }
  MFIter::~MFIter(in_stack_fffffffffffffd80);
  *(undefined1 *)(in_RDI + 0x566) = 1;
  return;
}

Assistant:

void
MLNodeLinOp::setOversetMask (int amrlev, const iMultiFab& a_dmask)
{
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(*m_dirichlet_mask[amrlev][0], TilingIfNotGPU()); mfi.isValid(); ++mfi) {
        Array4<int const> const& omsk = a_dmask.const_array(mfi);
        Array4<int> const& dmsk = m_dirichlet_mask[amrlev][0]->array(mfi);
        Box const& bx = mfi.tilebox();
        AMREX_HOST_DEVICE_PARALLEL_FOR_3D(bx, i, j, k,
        {
            dmsk(i,j,k) = 1 - omsk(i,j,k);
        });
    }
    m_overset_dirichlet_mask = true;
}